

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

void generate_reset_token(st_quicly_default_encrypt_cid_t *self,void *token,void *cid)

{
  undefined1 *in_RDX;
  ptls_cipher_context_t *in_RSI;
  long in_RDI;
  uint8_t expandbuf [16];
  size_t in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  if (*(long *)(**(long **)(in_RDI + 0x28) + 0x10) != 0x10) {
    __assert_fail("self->reset_token_ctx->algo->block_size == QUICLY_STATELESS_RESET_TOKEN_LEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                  ,99,
                  "void generate_reset_token(struct st_quicly_default_encrypt_cid_t *, void *, const void *)"
                 );
  }
  if (*(long *)(**(long **)(in_RDI + 0x18) + 0x10) != 0x10) {
    if (0xf < *(ulong *)(**(long **)(in_RDI + 0x18) + 0x10)) {
      __assert_fail("self->cid_encrypt_ctx->algo->block_size < QUICLY_STATELESS_RESET_TOKEN_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0x67,
                    "void generate_reset_token(struct st_quicly_default_encrypt_cid_t *, void *, const void *)"
                   );
    }
    memset(&stack0xffffffffffffffd8,0,0x10);
    memcpy(&stack0xffffffffffffffd8,in_RDX,*(size_t *)(**(long **)(in_RDI + 0x18) + 0x10));
    in_RDX = &stack0xffffffffffffffd8;
  }
  ptls_cipher_encrypt(in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void generate_reset_token(struct st_quicly_default_encrypt_cid_t *self, void *token, const void *cid)
{
    uint8_t expandbuf[QUICLY_STATELESS_RESET_TOKEN_LEN];

    assert(self->reset_token_ctx->algo->block_size == QUICLY_STATELESS_RESET_TOKEN_LEN);

    /* expand the input to full size, if CID is shorter than the size of the reset token */
    if (self->cid_encrypt_ctx->algo->block_size != QUICLY_STATELESS_RESET_TOKEN_LEN) {
        assert(self->cid_encrypt_ctx->algo->block_size < QUICLY_STATELESS_RESET_TOKEN_LEN);
        memset(expandbuf, 0, sizeof(expandbuf));
        memcpy(expandbuf, cid, self->cid_encrypt_ctx->algo->block_size);
        cid = expandbuf;
    }

    /* transform */
    ptls_cipher_encrypt(self->reset_token_ctx, token, cid, QUICLY_STATELESS_RESET_TOKEN_LEN);
}